

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::scrollToBottom(QAbstractItemView *this)

{
  int value;
  QScrollBar *this_00;
  QScrollBar *this_01;
  
  if ((*(QAbstractItemViewPrivate **)(this + 8))->delayedPendingLayout == true) {
    QAbstractItemViewPrivate::executePostedLayout(*(QAbstractItemViewPrivate **)(this + 8));
    (**(code **)(*(long *)this + 0x268))(this);
  }
  this_00 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  this_01 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  value = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
  QAbstractSlider::setValue(&this_00->super_QAbstractSlider,value);
  return;
}

Assistant:

void QAbstractItemView::scrollToBottom()
{
    Q_D(QAbstractItemView);
    if (d->delayedPendingLayout) {
        d->executePostedLayout();
        updateGeometries();
    }
    verticalScrollBar()->setValue(verticalScrollBar()->maximum());
}